

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O3

void callhook(lua_State *L,int event,BCLine line)

{
  uint64_t uVar1;
  code *pcVar2;
  byte bVar3;
  lua_Debug ar;
  int local_90 [10];
  BCLine local_68;
  undefined4 local_1c;
  
  uVar1 = (L->glref).ptr64;
  pcVar2 = *(code **)(uVar1 + 0x150);
  if ((pcVar2 != (code *)0x0) && (bVar3 = *(byte *)(uVar1 + 0x91), (bVar3 & 0x10) == 0)) {
    *(byte *)(uVar1 + 0x3cc) = *(byte *)(uVar1 + 0x3cc) & 0xef;
    local_1c = (undefined4)((long)L->base + (-8 - (L->stack).ptr64) >> 3);
    local_90[0] = event;
    local_68 = line;
    if ((long)((L->maxstack).ptr64 - (long)L->top) < 0xa9) {
      lj_state_growstack(L,0x15);
      bVar3 = *(byte *)(uVar1 + 0x91);
    }
    *(byte *)(uVar1 + 0x91) = bVar3 | 0x10;
    (*pcVar2)(L,local_90);
    *(lua_State **)(uVar1 + 0x170) = L;
    *(byte *)(uVar1 + 0x91) = *(byte *)(uVar1 + 0x91) & 0xef;
  }
  return;
}

Assistant:

static void callhook(lua_State *L, int event, BCLine line)
{
  global_State *g = G(L);
  lua_Hook hookf = g->hookf;
  if (hookf && !hook_active(g)) {
    lua_Debug ar;
    lj_trace_abort(g);  /* Abort recording on any hook call. */
    ar.event = event;
    ar.currentline = line;
    /* Top frame, nextframe = NULL. */
    ar.i_ci = (int)((L->base-1) - tvref(L->stack));
    lj_state_checkstack(L, 1+LUA_MINSTACK);
#if LJ_HASPROFILE && !LJ_PROFILE_SIGPROF
    lj_profile_hook_enter(g);
#else
    hook_enter(g);
#endif
    hookf(L, &ar);
    lj_assertG(hook_active(g), "active hook flag removed");
    setgcref(g->cur_L, obj2gco(L));
#if LJ_HASPROFILE && !LJ_PROFILE_SIGPROF
    lj_profile_hook_leave(g);
#else
    hook_leave(g);
#endif
  }
}